

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O0

void Cec_ManPatComputePattern1_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vPat)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *vPat_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar2 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar2 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar2 = Gia_ObjIsCi(pObj);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsAnd(pObj);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                      ,0xb4,
                      "void Cec_ManPatComputePattern1_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      if (((uint)((ulong)*(undefined8 *)pObj >> 0x3e) & 1) == 1) {
        pGVar4 = Gia_ObjFanin0(pObj);
        Cec_ManPatComputePattern1_rec(p,pGVar4,vPat);
        pGVar4 = Gia_ObjFanin1(pObj);
        Cec_ManPatComputePattern1_rec(p,pGVar4,vPat);
      }
      else {
        pGVar4 = Gia_ObjFanin0(pObj);
        uVar1 = *(undefined8 *)pGVar4;
        uVar3 = Gia_ObjFaninC0(pObj);
        if (((uint)((ulong)uVar1 >> 0x3e) & 1) != uVar3) {
          pGVar4 = Gia_ObjFanin1(pObj);
          uVar1 = *(undefined8 *)pGVar4;
          uVar3 = Gia_ObjFaninC1(pObj);
          if (((uint)((ulong)uVar1 >> 0x3e) & 1) != uVar3) {
            __assert_fail("(Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 || (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                          ,0xbd,
                          "void Cec_ManPatComputePattern1_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                         );
          }
        }
        pGVar4 = Gia_ObjFanin0(pObj);
        uVar1 = *(undefined8 *)pGVar4;
        uVar3 = Gia_ObjFaninC0(pObj);
        if (((uint)((ulong)uVar1 >> 0x3e) & 1) == uVar3) {
          pGVar4 = Gia_ObjFanin0(pObj);
          Cec_ManPatComputePattern1_rec(p,pGVar4,vPat);
        }
        else {
          pGVar4 = Gia_ObjFanin1(pObj);
          Cec_ManPatComputePattern1_rec(p,pGVar4,vPat);
        }
      }
    }
    else {
      iVar2 = Gia_ObjCioId(pObj);
      iVar2 = Abc_Var2Lit(iVar2,(uint)((*(ulong *)pObj >> 0x3e & 1) == 0));
      Vec_IntPush(vPat,iVar2);
    }
  }
  return;
}

Assistant:

void Cec_ManPatComputePattern1_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vPat )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vPat, Abc_Var2Lit( Gia_ObjCioId(pObj), pObj->fMark1==0 ) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    if ( pObj->fMark1 == 1 )
    {
        Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin0(pObj), vPat );
        Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin1(pObj), vPat );
    }
    else
    {
        assert( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 ||
                (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0 );
        if ( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 )
            Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin0(pObj), vPat );
        else
            Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin1(pObj), vPat );
    }
}